

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cpp
# Opt level: O3

void __thiscall unit_test::delayed_with_response(unit_test *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar1 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ptime pVar3;
  undefined1 local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  intrusive_ptr<unit_test> local_38;
  binder local_30;
  
  cppcms::application::release_context();
  p_Var2 = p_Stack_40;
  auVar1 = local_48;
  local_48 = (undefined1  [8])0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar1;
  (this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  local_48 = (undefined1  [8])0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(p_Stack_40._4_4_,300000000);
  booster::ptime::normalize((ptime *)local_48);
  pVar3._8_8_ = local_48;
  pVar3.sec = (longlong)&this->timer_;
  booster::aio::deadline_timer::expires_from_now(pVar3);
  local_38.p_ = this;
  booster::intrusive_ptr_add_ref(&this->super_application);
  local_30.self.p_ = this;
  booster::intrusive_ptr_add_ref(&this->super_application);
  local_30.m = (member_type)handle2;
  local_30._16_8_ = 0;
  booster::callback<void_(const_std::error_code_&)>::callback<unit_test::binder>
            ((callback<void_(const_std::error_code_&)> *)local_48,&local_30);
  booster::aio::deadline_timer::async_wait((callback *)&this->timer_);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_48);
  booster::intrusive_ptr<unit_test>::~intrusive_ptr(&local_30.self);
  booster::intrusive_ptr<unit_test>::~intrusive_ptr(&local_38);
  return;
}

Assistant:

void delayed_with_response()
	{
		context_ = release_context();
		timer_.expires_from_now(booster::ptime::milliseconds(300));
		timer_.async_wait(binder(this,&unit_test::handle2));
	}